

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeType(WasmBinaryWriter *this,Type type)

{
  BufferWithRandomAccess *pBVar1;
  bool bVar2;
  Shareability share;
  BasicHeapType BVar3;
  Exactness exactness;
  BasicType BVar4;
  S32LEB local_a8;
  int local_a4;
  HeapType HStack_a0;
  int ret;
  S32LEB local_94;
  S32LEB local_90;
  S32LEB local_8c;
  S32LEB local_88;
  S32LEB local_84;
  S32LEB local_80;
  S32LEB local_7c;
  S32LEB local_78;
  S32LEB local_74;
  S32LEB local_70;
  S32LEB local_6c;
  S32LEB local_68;
  S32LEB local_64;
  S32LEB local_60;
  S32LEB local_5c;
  S32LEB local_58;
  S32LEB local_54;
  HeapType local_50;
  HeapType heapType;
  HeapType local_40;
  Type local_38;
  HeapType local_30;
  Type local_28;
  HeapType local_20;
  HeapType ht;
  WasmBinaryWriter *this_local;
  Type type_local;
  
  ht.id = (uintptr_t)this;
  this_local = (WasmBinaryWriter *)type.id;
  bVar2 = wasm::Type::isRef((Type *)&this_local);
  if (!bVar2) {
    local_a4 = 0;
    bVar2 = wasm::Type::isTuple((Type *)&this_local);
    if (bVar2) {
      __assert_fail("!type.isTuple() && \"Unexpected tuple type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x674,"void wasm::WasmBinaryWriter::writeType(Type)");
    }
    bVar2 = wasm::Type::isBasic((Type *)&this_local);
    if (bVar2) {
      BVar4 = wasm::Type::getBasic((Type *)&this_local);
      switch(BVar4) {
      case none:
        local_a4 = -0x40;
        break;
      default:
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                           ,0x68a);
      case i32:
        local_a4 = -1;
        break;
      case i64:
        local_a4 = -2;
        break;
      case f32:
        local_a4 = -3;
        break;
      case f64:
        local_a4 = -4;
        break;
      case v128:
        local_a4 = -5;
      }
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_a8,local_a4);
      BufferWithRandomAccess::operator<<(pBVar1,local_a8);
      return;
    }
    __assert_fail("type.isBasic() && \"TODO: handle compound types\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                  ,0x674,"void wasm::WasmBinaryWriter::writeType(Type)");
  }
  bVar2 = FeatureSet::hasGC(&this->wasm->features);
  if (!bVar2) {
    local_20 = wasm::Type::getHeapType((Type *)&this_local);
    bVar2 = HeapType::isMaybeShared(&local_20,string);
    if (bVar2) {
      share = HeapType::getShared(&local_20);
      BVar3 = HeapType::getBasic((HeapType *)&HeapTypes::string,share);
      HeapType::HeapType(&local_30,BVar3);
      wasm::Type::Type(&local_28,local_30,Nullable,Inexact);
      this_local = (WasmBinaryWriter *)local_28.id;
    }
    else {
      heapType = wasm::Type::getHeapType((Type *)&this_local);
      BVar3 = HeapType::getTop(&heapType);
      HeapType::HeapType(&local_40,BVar3);
      wasm::Type::Type(&local_38,local_40,Nullable,Inexact);
      this_local = (WasmBinaryWriter *)local_38.id;
    }
  }
  local_50 = wasm::Type::getHeapType((Type *)&this_local);
  bVar2 = wasm::Type::isNullable((Type *)&this_local);
  if (((!bVar2) || (bVar2 = HeapType::isBasic(&local_50), !bVar2)) ||
     (bVar2 = HeapType::isShared(&local_50), bVar2)) {
LAB_025be6ef:
    bVar2 = wasm::Type::isNullable((Type *)&this_local);
    if (bVar2) {
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_90,-0x1d);
      BufferWithRandomAccess::operator<<(pBVar1,local_90);
    }
    else {
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_94,-0x1c);
      BufferWithRandomAccess::operator<<(pBVar1,local_94);
    }
    HStack_a0 = wasm::Type::getHeapType((Type *)&this_local);
    exactness = wasm::Type::getExactness((Type *)&this_local);
    writeHeapType(this,HStack_a0,exactness);
  }
  else {
    BVar3 = HeapType::getBasic(&local_50,Unshared);
    switch(BVar3) {
    case ext:
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_54,-0x11);
      BufferWithRandomAccess::operator<<(pBVar1,local_54);
      break;
    default:
      goto LAB_025be6ef;
    case func:
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_5c,-0x10);
      BufferWithRandomAccess::operator<<(pBVar1,local_5c);
      break;
    case cont:
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_60,-0x18);
      BufferWithRandomAccess::operator<<(pBVar1,local_60);
      break;
    case any:
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_58,-0x12);
      BufferWithRandomAccess::operator<<(pBVar1,local_58);
      break;
    case eq:
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_64,-0x13);
      BufferWithRandomAccess::operator<<(pBVar1,local_64);
      break;
    case i31:
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_68,-0x14);
      BufferWithRandomAccess::operator<<(pBVar1,local_68);
      break;
    case struct_:
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_6c,-0x15);
      BufferWithRandomAccess::operator<<(pBVar1,local_6c);
      break;
    case array:
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_70,-0x16);
      BufferWithRandomAccess::operator<<(pBVar1,local_70);
      break;
    case exn:
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_74,-0x17);
      BufferWithRandomAccess::operator<<(pBVar1,local_74);
      break;
    case string:
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_78,-0x19);
      BufferWithRandomAccess::operator<<(pBVar1,local_78);
      break;
    case none:
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_7c,-0xf);
      BufferWithRandomAccess::operator<<(pBVar1,local_7c);
      break;
    case noext:
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_80,-0xe);
      BufferWithRandomAccess::operator<<(pBVar1,local_80);
      break;
    case nofunc:
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_84,-0xd);
      BufferWithRandomAccess::operator<<(pBVar1,local_84);
      break;
    case nocont:
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_8c,-0xb);
      BufferWithRandomAccess::operator<<(pBVar1,local_8c);
      break;
    case noexn:
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_88,-0xc);
      BufferWithRandomAccess::operator<<(pBVar1,local_88);
    }
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeType(Type type) {
  if (type.isRef()) {
    // The only reference types allowed without GC are funcref, externref, and
    // exnref. We internally use more refined versions of those types, but we
    // cannot emit those without GC.
    if (!wasm->features.hasGC()) {
      auto ht = type.getHeapType();
      if (ht.isMaybeShared(HeapType::string)) {
        // Do not overgeneralize stringref to anyref. We have tests that when a
        // stringref is expected, we actually get a stringref. If we see a
        // string, the stringref feature must be enabled.
        type = Type(HeapTypes::string.getBasic(ht.getShared()), Nullable);
      } else {
        // Only the top type (func, extern, exn) is available, and only the
        // nullable version.
        type = Type(type.getHeapType().getTop(), Nullable);
      }
    }
    auto heapType = type.getHeapType();
    if (type.isNullable() && heapType.isBasic() && !heapType.isShared()) {
      switch (heapType.getBasic(Unshared)) {
        case HeapType::ext:
          o << S32LEB(BinaryConsts::EncodedType::externref);
          return;
        case HeapType::any:
          o << S32LEB(BinaryConsts::EncodedType::anyref);
          return;
        case HeapType::func:
          o << S32LEB(BinaryConsts::EncodedType::funcref);
          return;
        case HeapType::cont:
          o << S32LEB(BinaryConsts::EncodedType::contref);
          return;
        case HeapType::eq:
          o << S32LEB(BinaryConsts::EncodedType::eqref);
          return;
        case HeapType::i31:
          o << S32LEB(BinaryConsts::EncodedType::i31ref);
          return;
        case HeapType::struct_:
          o << S32LEB(BinaryConsts::EncodedType::structref);
          return;
        case HeapType::array:
          o << S32LEB(BinaryConsts::EncodedType::arrayref);
          return;
        case HeapType::exn:
          o << S32LEB(BinaryConsts::EncodedType::exnref);
          return;
        case HeapType::string:
          o << S32LEB(BinaryConsts::EncodedType::stringref);
          return;
        case HeapType::none:
          o << S32LEB(BinaryConsts::EncodedType::nullref);
          return;
        case HeapType::noext:
          o << S32LEB(BinaryConsts::EncodedType::nullexternref);
          return;
        case HeapType::nofunc:
          o << S32LEB(BinaryConsts::EncodedType::nullfuncref);
          return;
        case HeapType::noexn:
          o << S32LEB(BinaryConsts::EncodedType::nullexnref);
          return;
        case HeapType::nocont:
          o << S32LEB(BinaryConsts::EncodedType::nullcontref);
          return;
      }
    }
    if (type.isNullable()) {
      o << S32LEB(BinaryConsts::EncodedType::nullable);
    } else {
      o << S32LEB(BinaryConsts::EncodedType::nonnullable);
    }
    writeHeapType(type.getHeapType(), type.getExactness());
    return;
  }
  int ret = 0;
  TODO_SINGLE_COMPOUND(type);
  switch (type.getBasic()) {
    // None only used for block signatures. TODO: Separate out?
    case Type::none:
      ret = BinaryConsts::EncodedType::Empty;
      break;
    case Type::i32:
      ret = BinaryConsts::EncodedType::i32;
      break;
    case Type::i64:
      ret = BinaryConsts::EncodedType::i64;
      break;
    case Type::f32:
      ret = BinaryConsts::EncodedType::f32;
      break;
    case Type::f64:
      ret = BinaryConsts::EncodedType::f64;
      break;
    case Type::v128:
      ret = BinaryConsts::EncodedType::v128;
      break;
    default:
      WASM_UNREACHABLE("unexpected type");
  }
  o << S32LEB(ret);
}